

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionNoThrow_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionNoThrow_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, ExceptionNoThrow)
{
    if( int x = 1 )
        IUTEST_ASSERT_NO_THROW((void)x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NO_THROW((void)x) << x;
    if( int x = 1 )
        IUTEST_INFORM_NO_THROW((void)x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NO_THROW((void)x) << x;
}